

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

int mcpl_closeandgzip_outfile(mcpl_outfile_t of)

{
  char *filename;
  int iVar1;
  
  filename = *of.internal;
  *(undefined8 *)of.internal = 0;
  mcpl_close_outfile(of);
  iVar1 = mcpl_gzip_file(filename);
  free(filename);
  return iVar1;
}

Assistant:

int mcpl_closeandgzip_outfile(mcpl_outfile_t of)
{
  MCPLIMP_OUTFILEDECODE;
  char * filename = f->filename;
  f->filename = NULL;//prevent free in mcpl_close_outfile
  mcpl_close_outfile(of);
  int rc = mcpl_gzip_file(filename);
  free(filename);
  return rc;
}